

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O0

void setter_thread_body(void *arg)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  int i;
  void *arg_local;
  
  eval_a._4_4_ = 0;
  while( true ) {
    if (0x31 < eval_a._4_4_) {
      return;
    }
    iVar1 = uv_set_process_title(titles[0]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
              ,0x49,"uv_set_process_title(titles[0])","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_set_process_title(titles[1]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
              ,0x4a,"uv_set_process_title(titles[1])","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_set_process_title(titles[2]);
    if ((long)iVar1 != 0) break;
    iVar1 = uv_set_process_title(titles[3]);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
              ,0x4c,"uv_set_process_title(titles[3])","==","0",(long)iVar1,"==",0);
      abort();
    }
    eval_a._4_4_ = eval_a._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-title-threadsafe.c"
          ,0x4b,"uv_set_process_title(titles[2])","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

static void setter_thread_body(void* arg) {
  int i;

  for (i = 0; i < NUM_ITERATIONS; i++) {
    ASSERT_OK(uv_set_process_title(titles[0]));
    ASSERT_OK(uv_set_process_title(titles[1]));
    ASSERT_OK(uv_set_process_title(titles[2]));
    ASSERT_OK(uv_set_process_title(titles[3]));
  }
}